

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O1

uint32_t cpu_lduw_data_ra_mips64(CPUArchState_conflict11 *env,target_ulong ptr,uintptr_t retaddr)

{
  uint64_t uVar1;
  TCGMemOpIdx oi;
  
  oi = 0x93;
  if ((env->hflags >> 0x1c & 1) == 0) {
    oi = env->hflags & 3 | 0x90;
  }
  uVar1 = load_helper(env,ptr,oi,retaddr,MO_BEUW,false,full_be_lduw_mmu);
  return (uint32_t)uVar1;
}

Assistant:

uint32_t cpu_lduw_data_ra(CPUArchState *env, target_ulong ptr,
                          uintptr_t retaddr)
{
    return cpu_lduw_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}